

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.cpp
# Opt level: O1

VariableStruct * __thiscall
adios2::core::IO::InquireStructVariable
          (IO *this,string *name,StructDefinition *def,bool allowReorganize)

{
  int iVar1;
  DataType DVar2;
  DataType DVar3;
  VariableStruct *pVVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  bool bVar8;
  string local_70;
  string local_50;
  
  pVVar4 = InquireStructVariable(this,name);
  if (pVVar4 != (VariableStruct *)0x0) {
    sVar5 = StructDefinition::Fields(pVVar4->m_WriteStructDefinition);
    sVar6 = StructDefinition::Fields(def);
    if (sVar5 == sVar6) {
      sVar5 = StructDefinition::Fields(def);
      if (sVar5 == 0) {
        return pVVar4;
      }
      sVar5 = 0;
      while( true ) {
        StructDefinition::Name_abi_cxx11_(&local_50,pVVar4->m_WriteStructDefinition,sVar5);
        StructDefinition::Name_abi_cxx11_(&local_70,def,sVar5);
        bVar8 = true;
        if (local_50._M_string_length == local_70._M_string_length) {
          if (local_50._M_string_length == 0) {
            bVar8 = false;
          }
          else {
            iVar1 = bcmp(local_50._M_dataplus._M_p,local_70._M_dataplus._M_p,
                         local_50._M_string_length);
            bVar8 = iVar1 != 0;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        if (bVar8) break;
        sVar6 = StructDefinition::Offset(pVVar4->m_WriteStructDefinition,sVar5);
        sVar7 = StructDefinition::Offset(def,sVar5);
        if (sVar6 != sVar7 && !allowReorganize) {
          return (VariableStruct *)0x0;
        }
        DVar2 = StructDefinition::Type(pVVar4->m_WriteStructDefinition,sVar5);
        DVar3 = StructDefinition::Type(def,sVar5);
        if (DVar2 != DVar3) {
          return (VariableStruct *)0x0;
        }
        sVar6 = StructDefinition::ElementCount(pVVar4->m_WriteStructDefinition,sVar5);
        sVar7 = StructDefinition::ElementCount(def,sVar5);
        if (sVar6 != sVar7) {
          return (VariableStruct *)0x0;
        }
        sVar5 = sVar5 + 1;
        sVar6 = StructDefinition::Fields(def);
        if (sVar6 <= sVar5) {
          return pVVar4;
        }
      }
    }
  }
  return (VariableStruct *)0x0;
}

Assistant:

VariableStruct *IO::InquireStructVariable(const std::string &name, const StructDefinition &def,
                                          const bool allowReorganize) noexcept
{
    auto ret = InquireStructVariable(name);
    if (ret == nullptr)
    {
        return nullptr;
    }

    if (ret->m_WriteStructDefinition->Fields() != def.Fields())
    {
        return nullptr;
    }

    for (size_t i = 0; i < def.Fields(); ++i)
    {
        if (ret->m_WriteStructDefinition->Name(i) != def.Name(i))
        {
            return nullptr;
        }
        if (ret->m_WriteStructDefinition->Offset(i) != def.Offset(i) && !allowReorganize)
        {
            return nullptr;
        }
        if (ret->m_WriteStructDefinition->Type(i) != def.Type(i))
        {
            return nullptr;
        }
        if (ret->m_WriteStructDefinition->ElementCount(i) != def.ElementCount(i))
        {
            return nullptr;
        }
    }

    return ret;
}